

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_rwkv6qwen2::llm_build_rwkv6qwen2
          (llm_build_rwkv6qwen2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  ulong uVar12;
  long lVar13;
  ggml_tensor *this_00;
  const_reference pvVar14;
  pointer plVar15;
  ggml_tensor *in_RCX;
  ggml_cgraph *in_RDX;
  llm_build_rwkv6_base *in_RSI;
  long in_RDI;
  ggml_backend_buffer *name;
  llama_ubatch *unaff_retaddr;
  int in_stack_00000008;
  ggml_tensor *inp_out_ids;
  ggml_tensor *ffn_inp;
  ggml_tensor *x_prev;
  ggml_tensor *att_norm;
  ggml_tensor *token_shift;
  llama_layer *layer;
  int il;
  uint32_t n_seqs;
  uint32_t n_seq_tokens;
  uint32_t n_embd;
  ggml_tensor *state_mask;
  ggml_tensor *state_copy;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  ggml_tensor *in_stack_fffffffffffffdb8;
  int iVar16;
  llm_graph_context *in_stack_fffffffffffffdc0;
  llama_model *in_stack_fffffffffffffdc8;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  llm_graph_context *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  ggml_tensor *in_stack_fffffffffffffe20;
  ggml_cgraph *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe78;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe88;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffec8;
  llm_graph_context *in_stack_fffffffffffffed0;
  ggml_tensor *local_88;
  int local_60;
  ggml_tensor *local_40;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_tensor *in_stack_ffffffffffffffd0;
  ggml_tensor *in_stack_ffffffffffffffd8;
  
  llm_build_rwkv6_base::llm_build_rwkv6_base
            ((llm_build_rwkv6_base *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (llm_graph_params *)in_stack_fffffffffffffdc0);
  uVar12 = *(ulong *)(in_RDI + 0x20);
  uVar6 = llama_hparams::n_embd_k_s(*(llama_hparams **)(in_RDI + 8));
  if (uVar12 != uVar6) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2d9f,"GGML_ASSERT(%s) failed","n_embd == hparams.n_embd_k_s()");
  }
  local_40 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  llm_graph_context::build_inp_s_copy((llm_graph_context *)in_stack_fffffffffffffe20);
  llm_graph_context::build_inp_s_mask((llm_graph_context *)in_stack_fffffffffffffe20);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 8);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x18) + 8);
  uVar3 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0xc);
  for (local_60 = 0; iVar16 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
      (long)local_60 < *(long *)(in_RDI + 0x28); local_60 = local_60 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)
               &in_RSI[0x18].super_llm_graph_context.n_embd_k_gqa,(long)local_60);
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_40,uVar1,iVar2,uVar3);
    pgVar8 = llm_graph_context::build_rwkv_token_shift_load
                       ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        (llama_ubatch *)in_stack_fffffffffffffe10,SUB84(in_stack_fffffffffffffe08,4)
                       );
    pgVar9 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffdd0,(ggml_tensor *)in_stack_fffffffffffffdc8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                        (int)in_stack_fffffffffffffdc0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdd0,
               (ggml_tensor *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,iVar16);
    uVar4 = *(undefined8 *)(in_RDI + 0xc0);
    uVar10 = ggml_view_3d(uVar4,pgVar9,uVar1,iVar2 + -1,uVar3,pgVar9->nb[1]);
    ggml_concat(uVar4,pgVar8,uVar10,1);
    pgVar11 = llm_build_rwkv6_base::build_rwkv6_time_mix
                        (in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008);
    uVar4 = *(undefined8 *)(in_RDI + 0xc0);
    uVar12 = (ulong)uVar1;
    sVar5 = pgVar9->nb[1];
    iVar16 = (int)(pgVar9->nb[2] >> 0x20);
    lVar13 = ggml_element_size();
    name = (ggml_backend_buffer *)((ulong)((iVar2 + -1) * uVar1) * lVar13);
    ggml_view_3d(uVar4,pgVar9,uVar12,1,uVar3,sVar5);
    pgVar9 = in_RCX;
    pgVar8 = llm_graph_context::build_rwkv_token_shift_store
                       ((llm_graph_context *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        (llama_ubatch *)in_stack_fffffffffffffe10,SUB84(in_stack_fffffffffffffe08,4)
                       );
    ggml_build_forward_expand(in_RCX,pgVar8);
    il_00 = (int)pgVar8;
    type_gate = (llm_ffn_gate_type)in_RCX;
    local_88 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar7);
    pgVar8 = local_88;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdd0,
               (ggml_tensor *)in_stack_fffffffffffffdc8,(char *)name,iVar16);
    type_op = (llm_ffn_op_type)pgVar8;
    in_RCX = pgVar9;
    if ((long)local_60 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar8 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe88 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffe98 = pgVar8;
      in_stack_fffffffffffffe90 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffe88,pgVar11,uVar1,(long)*(int *)(in_RDI + 0xa8));
      in_stack_fffffffffffffe80 =
           (ggml_tensor *)ggml_get_rows(in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,pgVar8);
      in_stack_fffffffffffffe70 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffe78 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffe70,local_88,uVar1,(long)*(int *)(in_RDI + 0xa8));
      local_88 = (ggml_tensor *)
                 ggml_get_rows(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,pgVar8);
      in_RCX = pgVar9;
    }
    pgVar11 = local_88;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)
               &in_RSI[0x18].super_llm_graph_context.n_embd_k_gqa,(long)local_60);
    this_00 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0,(ggml_tensor *)in_stack_fffffffffffffdc8,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    in_stack_fffffffffffffe30 = this_00;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdd0,
               (ggml_tensor *)in_stack_fffffffffffffdc8,(char *)name,iVar16);
    pvVar14 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x18].super_llm_graph_context.n_embd_k_gqa,(long)local_60);
    pgVar8 = pvVar14->ffn_up;
    pvVar14 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x18].super_llm_graph_context.n_embd_k_gqa,(long)local_60);
    pgVar9 = pvVar14->ffn_gate;
    pvVar14 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x18].super_llm_graph_context.n_embd_k_gqa,(long)local_60);
    in_stack_fffffffffffffdc8 = (llama_model *)pvVar14->ffn_down;
    in_stack_fffffffffffffde0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdd8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdd0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdc0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdb8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe50 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)this_00,pgVar11,in_stack_fffffffffffffe50,
                    (ggml_tensor *)&stack0xfffffffffffffdb8,pgVar9,pgVar8,in_stack_fffffffffffffe70,
                    in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                    in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,type_op,type_gate,il_00);
    pgVar8 = in_stack_fffffffffffffe50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdd0,
               (ggml_tensor *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
               (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    in_stack_fffffffffffffe28 =
         (ggml_cgraph *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar8,local_88);
    in_stack_fffffffffffffe20 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    local_40 = in_stack_fffffffffffffe20;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdd0,
               (ggml_tensor *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
               (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    in_stack_ffffffffffffffc8 = local_40;
  }
  pgVar9 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                      (ggml_tensor *)in_stack_fffffffffffffdc8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                      (int)in_stack_fffffffffffffdc0);
  pgVar8 = pgVar9;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdd0,(ggml_tensor *)in_stack_fffffffffffffdc8
             ,(char *)in_stack_fffffffffffffdc0,iVar16);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4fae48);
  plVar15->t_embd = pgVar8;
  pgVar9 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe20,pgVar9,
                      in_stack_fffffffffffffe10);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdd0,(ggml_tensor *)in_stack_fffffffffffffdc8
             ,(char *)in_stack_fffffffffffffdc0,iVar16);
  pgVar8 = pgVar9;
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4faecd);
  plVar15->t_logits = pgVar9;
  ggml_build_forward_expand(in_RCX,pgVar8);
  return;
}

Assistant:

llm_build_rwkv6qwen2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv6_base(model, params) {
        GGML_ASSERT(n_embd == hparams.n_embd_k_s());

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM_RMS, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    token_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv6_time_mix(gf, att_norm, x_prev, state_copy, state_mask, ubatch, il);

            token_shift = ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm));
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur     = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, cur, n_embd, n_tokens), inp_out_ids);
                ffn_inp = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp, n_embd, n_tokens), inp_out_ids);
            }

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }